

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

TriangleFilter *
pbrt::TriangleFilter::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  allocator<char> local_39;
  float local_38;
  float local_34;
  string local_30;
  TriangleFilter *pTVar2;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"xradius",&local_39);
  local_34 = ParameterDictionary::GetOneFloat(parameters,&local_30,2.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"yradius",&local_39);
  local_38 = ParameterDictionary::GetOneFloat(parameters,&local_30,2.0);
  std::__cxx11::string::~string((string *)&local_30);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8,4);
  pTVar2 = (TriangleFilter *)CONCAT44(extraout_var,iVar1);
  (pTVar2->radius).super_Tuple2<pbrt::Vector2,_float>.x = local_34;
  (pTVar2->radius).super_Tuple2<pbrt::Vector2,_float>.y = local_38;
  return pTVar2;
}

Assistant:

TriangleFilter *TriangleFilter::Create(const ParameterDictionary &parameters,
                                       const FileLoc *loc, Allocator alloc) {
    // Find common filter parameters
    Float xw = parameters.GetOneFloat("xradius", 2.f);
    Float yw = parameters.GetOneFloat("yradius", 2.f);
    return alloc.new_object<TriangleFilter>(Vector2f(xw, yw));
}